

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O2

void cmInstallGenerator::AddTweak
               (ostream *os,Indent indent,string *config,string *file,TweakMethod *tweak)

{
  ostream *poVar1;
  string tws;
  ostringstream tw;
  string asStack_1c8 [8];
  long local_1c0;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::
  function<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(tweak,(basic_ostream<char,_std::char_traits<char>_> *)local_1a8,
               (cmScriptGeneratorIndent)(indent.Level + 2),config,file);
  std::__cxx11::stringbuf::str();
  if (local_1c0 != 0) {
    poVar1 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar1 = std::operator<<(poVar1,"if(EXISTS \"");
    poVar1 = std::operator<<(poVar1,(string *)file);
    poVar1 = std::operator<<(poVar1,"\" AND\n");
    poVar1 = operator<<(poVar1,(cmScriptGeneratorIndent)indent.Level);
    poVar1 = std::operator<<(poVar1,"   NOT IS_SYMLINK \"");
    poVar1 = std::operator<<(poVar1,(string *)file);
    std::operator<<(poVar1,"\")\n");
    std::operator<<(os,asStack_1c8);
    poVar1 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar1,"endif()\n");
  }
  std::__cxx11::string::~string(asStack_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void cmInstallGenerator::AddTweak(std::ostream& os, Indent indent,
                                  const std::string& config,
                                  std::string const& file,
                                  const TweakMethod& tweak)
{
  std::ostringstream tw;
  tweak(tw, indent.Next(), config, file);
  std::string tws = tw.str();
  if (!tws.empty()) {
    os << indent << "if(EXISTS \"" << file << "\" AND\n"
       << indent << "   NOT IS_SYMLINK \"" << file << "\")\n";
    os << tws;
    os << indent << "endif()\n";
  }
}